

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form1_ExtractChannel(ExtractChannelForm1 ExtractChannel)

{
  uint8_t value;
  bool bVar1;
  uint uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  ImageTemplate<unsigned_char> local_68;
  Image local_40;
  
  Unit_Test::intensityArray(&local_80,3);
  value = *local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_68,0,0,'\x01','\x01');
  Test_Helper::uniformRGBImage(&local_40,value,&local_68);
  local_68._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_68);
  Unit_Test::fillImage(&local_40,0,0,local_40._width,local_40._height,&local_80);
  uVar2 = rand();
  (*ExtractChannel)(&local_68,&local_40,(uint8_t)(uVar2 % 3));
  bVar1 = Unit_Test::verifyImage
                    (&local_68,
                     local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar2 % 3]);
  local_68._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_68);
  local_40._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_40);
  if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1 && local_68._colorCount == '\x01';
}

Assistant:

bool form1_ExtractChannel(ExtractChannelForm1 ExtractChannel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        PenguinV_Image::Image input = uniformRGBImage( intensity[0] );
        fillImage( input, 0, 0, input.width(), input.height(), intensity );

        const uint8_t channelId = randomValue<uint8_t>( 3 );

        const PenguinV_Image::Image output = ExtractChannel( input, channelId );

        return verifyImage( output, intensity[channelId] ) && (output.colorCount() == PenguinV_Image::GRAY_SCALE);
    }